

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occurrencetocsv.cpp
# Opt level: O0

void no_occ_doit(bool skipheader)

{
  size_t sVar1;
  int local_1c;
  undefined1 uStack_15;
  int i;
  occurrence q;
  bool skipheader_local;
  
  q.period_no._0_1_ = skipheader;
  if (!skipheader) {
    printf("event_id,period_no,occ_date_id\n");
  }
  sVar1 = fread(&uStack_15,0xc,1,_stdin);
  local_1c = (int)sVar1;
  while (local_1c != 0) {
    printf("%d, %d, %d\n",(ulong)_uStack_15,(ulong)stack0xffffffffffffffef,(ulong)(uint)q.event_id);
    sVar1 = fread(&uStack_15,0xc,1,_stdin);
    local_1c = (int)sVar1;
  }
  return;
}

Assistant:

void no_occ_doit(bool skipheader)
{
	if (skipheader == false) printf("event_id,period_no,occ_date_id\n");
	occurrence q;
	int i = fread(&q, sizeof(q), 1, stdin);
	while (i != 0) {
		printf("%d, %d, %d\n", q.event_id, q.period_no, q.occ_date_id);
		i = fread(&q, sizeof(q), 1, stdin);
	}
}